

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  U32 *pUVar3;
  seqDef *psVar4;
  bool bVar5;
  char cVar6;
  undefined8 uVar7;
  seqStore_t *psVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  ulong uVar12;
  int *piVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  int *mEnd;
  BYTE *pBVar17;
  uint uVar18;
  uint uVar19;
  int *iEnd;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  BYTE *pBVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  int *piVar27;
  int *piVar28;
  size_t ofbCandidate;
  size_t local_108;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  BYTE *local_f0;
  uint local_e4;
  ZSTD_matchState_t *local_e0;
  int *local_d8;
  int *local_d0;
  uint local_c4;
  ulong local_c0;
  seqStore_t *local_b8;
  int *local_b0;
  int *local_a8;
  BYTE *local_a0;
  uint *local_98;
  BYTE *local_90;
  uint local_84;
  int *local_80;
  BYTE *local_78;
  BYTE *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_f0 = (ms->window).base;
  local_f4 = (ms->cParams).minMatch;
  if (5 < local_f4) {
    local_f4 = 6;
  }
  if (local_f4 < 5) {
    local_f4 = 4;
  }
  local_c4 = (ms->cParams).searchLog;
  local_fc = 6;
  if (local_c4 < 6) {
    local_fc = local_c4;
  }
  uVar10 = (ms->window).dictLimit;
  local_c0 = (ulong)uVar10;
  if (local_fc < 5) {
    local_fc = 4;
  }
  local_a0 = local_f0 + local_c0;
  pZVar2 = ms->dictMatchState;
  local_90 = (pZVar2->window).base;
  local_70 = local_90 + (pZVar2->window).dictLimit;
  local_a8 = (int *)(pZVar2->window).nextSrc;
  iVar15 = (int)local_a8;
  uVar9 = ((int)src - ((int)local_70 + (int)local_a0)) + iVar15;
  piVar28 = (int *)((long)src + (ulong)(uVar9 == 0));
  local_f8 = *rep;
  local_d0 = (int *)src;
  if (uVar9 < local_f8) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar21 = rep[1];
  local_e4 = uVar21;
  local_b8 = seqStore;
  local_98 = rep;
  if (uVar9 < uVar21) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_b0 = (int *)((long)src + (srcSize - 0x10));
  ms->lazySkipping = 0;
  uVar9 = ms->nextToUpdate;
  uVar22 = (ulong)uVar9;
  uVar18 = ((int)local_b0 - (int)(local_f0 + uVar22)) + 1;
  uVar19 = 8;
  if (uVar18 < 8) {
    uVar19 = uVar18;
  }
  if (local_b0 < local_f0 + uVar22) {
    uVar19 = 0;
  }
  bVar14 = (byte)local_fc;
  local_e0 = ms;
  if (uVar9 < uVar19 + uVar9) {
    if (0x20 < ms->rowHashLog + 8) {
LAB_001e5fee:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar23 = ms->tagTable;
    uVar12 = ms->hashSalt;
    cVar6 = (char)ms->rowHashLog;
    do {
      if (local_f4 == 5) {
        uVar24 = *(long *)(local_f0 + uVar22) * -0x30e4432345000000;
LAB_001e54ab:
        uVar18 = (uint)((uVar24 ^ uVar12) >> (0x38U - cVar6 & 0x3f));
      }
      else {
        if (local_f4 == 6) {
          uVar24 = *(long *)(local_f0 + uVar22) * -0x30e4432340650000;
          goto LAB_001e54ab;
        }
        uVar18 = (*(int *)(local_f0 + uVar22) * -0x61c8864f ^ (uint)uVar12) >>
                 (0x18U - cVar6 & 0x1f);
      }
      uVar26 = (uVar18 >> 8) << (bVar14 & 0x1f);
      if (((ulong)(pUVar3 + uVar26) & 0x3f) != 0) {
LAB_001e5ef6:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32e,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar23 + uVar26) & ~(-1L << (bVar14 & 0x3f))) != 0) {
LAB_001e5ed7:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32f,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar22 & 7] = uVar18;
      uVar22 = uVar22 + 1;
    } while (uVar19 + uVar9 != uVar22);
  }
  iEnd = (int *)(srcSize + (long)src);
  if (piVar28 < local_b0) {
    local_84 = ((int)local_90 - iVar15) + uVar10;
    local_78 = local_90 + -(ulong)local_84;
    local_80 = iEnd + -8;
    local_50 = ~(-1L << (bVar14 & 0x3f));
    iVar16 = (int)local_f0;
    local_58 = (ulong)((1 - uVar10) - iVar16);
    local_60 = (ulong)(uint)-iVar16;
    local_68 = (ulong)((((iVar15 - uVar10) - (int)local_90) - iVar16) + 1);
    do {
      local_d8 = (int *)((long)piVar28 + 1);
      iVar15 = (int)piVar28;
      uVar10 = ((iVar15 - (int)local_f0) - local_f8) + 1;
      piVar13 = (int *)(local_f0 + uVar10);
      if (uVar10 < (uint)local_c0) {
        piVar13 = (int *)(local_90 + (uVar10 - local_84));
      }
      local_e4 = uVar21;
      if ((uVar10 - (uint)local_c0 < 0xfffffffd) && (*piVar13 == *local_d8)) {
        piVar27 = iEnd;
        if (uVar10 < (uint)local_c0) {
          piVar27 = local_a8;
        }
        sVar11 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar28 + 5),(BYTE *)(piVar13 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar27,local_a0);
        uVar22 = sVar11 + 4;
      }
      else {
        uVar22 = 0;
      }
      local_108 = 999999999;
      if (local_f4 == 6) {
        if (local_fc == 6) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                             (ms,(BYTE *)piVar28,(BYTE *)iEnd,&local_108);
        }
        else if (local_fc == 5) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                             (ms,(BYTE *)piVar28,(BYTE *)iEnd,&local_108);
        }
        else {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                             (ms,(BYTE *)piVar28,(BYTE *)iEnd,&local_108);
        }
      }
      else if (local_f4 == 5) {
        if (local_fc == 6) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                             (ms,(BYTE *)piVar28,(BYTE *)iEnd,&local_108);
        }
        else if (local_fc == 5) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                             (ms,(BYTE *)piVar28,(BYTE *)iEnd,&local_108);
        }
        else {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                             (ms,(BYTE *)piVar28,(BYTE *)iEnd,&local_108);
        }
      }
      else if (local_fc == 6) {
        uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                           (ms,(BYTE *)piVar28,(BYTE *)iEnd,&local_108);
      }
      else if (local_fc == 5) {
        uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                           (ms,(BYTE *)piVar28,(BYTE *)iEnd,&local_108);
      }
      else {
        uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                           (ms,(BYTE *)piVar28,(BYTE *)iEnd,&local_108);
      }
      uVar24 = uVar22;
      if (uVar22 < uVar12) {
        uVar24 = uVar12;
      }
      if (uVar24 < 4) {
        uVar22 = (long)piVar28 - (long)local_d0;
        piVar28 = (int *)((long)piVar28 + (uVar22 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar22);
        rep = local_98;
        uVar21 = local_e4;
      }
      else {
        piVar13 = piVar28;
        uVar25 = local_108;
        if (uVar12 <= uVar22) {
          piVar13 = local_d8;
          uVar25 = 1;
        }
        local_38 = (ulong)(((int)local_58 + iVar15) - local_f8);
        local_40 = (ulong)(((int)local_60 + iVar15) - local_f8);
        local_48 = (ulong)(((int)local_68 + iVar15) - local_f8);
        lVar20 = 0;
        local_d8 = piVar13;
        do {
          if (local_b0 <= (int *)((long)piVar28 + lVar20)) break;
          piVar27 = (int *)((long)piVar28 + lVar20 + 1);
          iVar15 = (int)lVar20;
          uVar10 = (int)local_40 + iVar15 + 1;
          piVar13 = (int *)(local_f0 + uVar10);
          if (uVar10 < (uint)local_c0) {
            piVar13 = (int *)(local_90 + (uint)((int)local_48 + iVar15));
          }
          if (((uint)((int)local_38 + iVar15) < 0xfffffffd) && (*piVar13 == *piVar27)) {
            mEnd = iEnd;
            if (uVar10 < (uint)local_c0) {
              mEnd = local_a8;
            }
            sVar11 = ZSTD_count_2segments
                               ((BYTE *)((long)piVar28 + lVar20 + 5),(BYTE *)(piVar13 + 1),
                                (BYTE *)iEnd,(BYTE *)mEnd,local_a0);
            uVar10 = (uint)uVar25;
            if (uVar10 == 0) goto LAB_001e5eb8;
            if (sVar11 < 0xfffffffffffffffc) {
              uVar9 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              if ((int)((uVar9 ^ 0x1f) + (int)uVar24 * 3 + -0x1e) < (int)(sVar11 + 4) * 3) {
                uVar25 = 1;
                uVar24 = sVar11 + 4;
                local_d8 = piVar27;
              }
            }
          }
          local_108 = 999999999;
          if (local_f4 == 6) {
            if (local_fc == 6) {
              uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                 (local_e0,(BYTE *)piVar27,(BYTE *)iEnd,&local_108);
            }
            else if (local_fc == 5) {
              uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                 (local_e0,(BYTE *)piVar27,(BYTE *)iEnd,&local_108);
            }
            else {
              uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                 (local_e0,(BYTE *)piVar27,(BYTE *)iEnd,&local_108);
            }
          }
          else if (local_f4 == 5) {
            if (local_fc == 6) {
              uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                 (local_e0,(BYTE *)piVar27,(BYTE *)iEnd,&local_108);
            }
            else if (local_fc == 5) {
              uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                 (local_e0,(BYTE *)piVar27,(BYTE *)iEnd,&local_108);
            }
            else {
              uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                 (local_e0,(BYTE *)piVar27,(BYTE *)iEnd,&local_108);
            }
          }
          else if (local_fc == 6) {
            uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                               (local_e0,(BYTE *)piVar27,(BYTE *)iEnd,&local_108);
          }
          else if (local_fc == 5) {
            uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                               (local_e0,(BYTE *)piVar27,(BYTE *)iEnd,&local_108);
          }
          else {
            uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                               (local_e0,(BYTE *)piVar27,(BYTE *)iEnd,&local_108);
          }
          uVar10 = (uint)local_108;
          if ((uVar10 == 0) || (uVar9 = (uint)uVar25, uVar9 == 0)) {
LAB_001e5eb8:
            __assert_fail("val != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                          ,0xab,"unsigned int ZSTD_highbit32(U32)");
          }
          bVar5 = true;
          if (3 < uVar22) {
            iVar15 = 0x1f;
            if (uVar10 != 0) {
              for (; uVar10 >> iVar15 == 0; iVar15 = iVar15 + -1) {
              }
            }
            uVar10 = 0x1f;
            if (uVar9 != 0) {
              for (; uVar9 >> uVar10 == 0; uVar10 = uVar10 - 1) {
              }
            }
            if ((int)((uVar10 ^ 0x1f) + (int)uVar24 * 4 + -0x1b) < (int)uVar22 * 4 - iVar15) {
              bVar5 = false;
              uVar25 = local_108;
              uVar24 = uVar22;
              local_d8 = piVar27;
            }
          }
          lVar20 = lVar20 + 1;
        } while (!bVar5);
        uVar21 = local_e4;
        if (3 < uVar25) {
          uVar22 = (long)local_d8 + (-(long)local_f0 - uVar25) + -0xfffffffd;
          pBVar17 = local_f0;
          pBVar23 = local_a0;
          if ((uint)uVar22 < (uint)local_c0) {
            pBVar17 = local_78;
            pBVar23 = local_70;
          }
          if ((local_d0 < local_d8) && (uVar22 = uVar22 & 0xffffffff, pBVar23 < pBVar17 + uVar22)) {
            pBVar17 = pBVar17 + uVar22;
            do {
              piVar28 = (int *)((long)local_d8 + -1);
              pBVar17 = pBVar17 + -1;
              if ((*(BYTE *)piVar28 != *pBVar17) ||
                 (uVar24 = uVar24 + 1, local_d8 = piVar28, piVar28 <= local_d0)) break;
            } while (pBVar23 < pBVar17);
          }
          uVar21 = local_f8;
          local_f8 = (U32)uVar25 - 3;
        }
        if (local_b8->maxNbSeq <=
            (ulong)((long)local_b8->sequences - (long)local_b8->sequencesStart >> 3)) {
LAB_001e5f15:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_b8->maxNbLit) {
LAB_001e5f53:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar22 = (long)local_d8 - (long)local_d0;
        pBVar23 = local_b8->lit;
        if (local_b8->litStart + local_b8->maxNbLit < pBVar23 + uVar22) {
LAB_001e5f91:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < local_d8) {
LAB_001e5f34:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_80 < local_d8) {
          ZSTD_safecopyLiterals(pBVar23,(BYTE *)local_d0,(BYTE *)local_d8,(BYTE *)local_80);
        }
        else {
          uVar7 = *(undefined8 *)(local_d0 + 2);
          *(undefined8 *)pBVar23 = *(undefined8 *)local_d0;
          *(undefined8 *)(pBVar23 + 8) = uVar7;
          if (0x10 < uVar22) {
            pBVar23 = local_b8->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar23 + 0x10 + (-0x10 - (long)(local_d0 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar7 = *(undefined8 *)(local_d0 + 6);
            *(undefined8 *)(pBVar23 + 0x10) = *(undefined8 *)(local_d0 + 4);
            *(undefined8 *)(pBVar23 + 0x18) = uVar7;
            if (0x20 < (long)uVar22) {
              lVar20 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_d0 + lVar20 + 0x20);
                uVar7 = puVar1[1];
                pBVar17 = pBVar23 + lVar20 + 0x20;
                *(undefined8 *)pBVar17 = *puVar1;
                *(undefined8 *)(pBVar17 + 8) = uVar7;
                puVar1 = (undefined8 *)((long)local_d0 + lVar20 + 0x30);
                uVar7 = puVar1[1];
                *(undefined8 *)(pBVar17 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar17 + 0x18) = uVar7;
                lVar20 = lVar20 + 0x20;
              } while (pBVar17 + 0x20 < pBVar23 + uVar22);
            }
          }
        }
        rep = local_98;
        psVar8 = local_b8;
        local_b8->lit = local_b8->lit + uVar22;
        if (0xffff < uVar22) {
          if (local_b8->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_b8->longLengthType = ZSTD_llt_literalLength;
          local_b8->longLengthPos =
               (U32)((ulong)((long)local_b8->sequences - (long)local_b8->sequencesStart) >> 3);
        }
        psVar4 = local_b8->sequences;
        psVar4->litLength = (U16)uVar22;
        psVar4->offBase = (U32)uVar25;
        if (uVar24 < 3) {
LAB_001e5f72:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar24 - 3) {
          if (local_b8->longLengthType != ZSTD_llt_none) {
LAB_001e5fb0:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_b8->longLengthType = ZSTD_llt_matchLength;
          local_b8->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_b8->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(uVar24 - 3);
        local_b8->sequences = psVar4 + 1;
        if (local_e0->lazySkipping != 0) {
          uVar10 = local_e0->nextToUpdate;
          uVar22 = (ulong)uVar10;
          uVar9 = ((int)local_b0 - (int)(local_f0 + uVar22)) + 1;
          if (7 < uVar9) {
            uVar9 = 8;
          }
          if (local_b0 < local_f0 + uVar22) {
            uVar9 = 0;
          }
          if (uVar10 < uVar9 + uVar10) {
            if (0x20 < local_e0->rowHashLog + 8) goto LAB_001e5fee;
            pUVar3 = local_e0->hashTable;
            pBVar23 = local_e0->tagTable;
            uVar12 = local_e0->hashSalt;
            cVar6 = (char)local_e0->rowHashLog;
            do {
              if (local_f4 == 5) {
                uVar25 = *(long *)(local_f0 + uVar22) * -0x30e4432345000000;
LAB_001e5c8b:
                uVar25 = (uVar25 ^ uVar12) >> (0x38U - cVar6 & 0x3f);
              }
              else {
                if (local_f4 == 6) {
                  uVar25 = *(long *)(local_f0 + uVar22) * -0x30e4432340650000;
                  goto LAB_001e5c8b;
                }
                uVar25 = (ulong)((*(int *)(local_f0 + uVar22) * -0x61c8864f ^ (uint)uVar12) >>
                                (0x18U - cVar6 & 0x1f));
              }
              uVar19 = ((uint)(uVar25 >> 8) & 0xffffff) << ((byte)local_fc & 0x1f);
              if (((ulong)(pUVar3 + uVar19) & 0x3f) != 0) goto LAB_001e5ef6;
              if ((local_50 & (ulong)(pBVar23 + uVar19)) != 0) goto LAB_001e5ed7;
              local_e0->hashCache[(uint)uVar22 & 7] = (U32)uVar25;
              uVar22 = uVar22 + 1;
            } while (uVar9 + uVar10 != uVar22);
          }
          local_e0->lazySkipping = 0;
        }
        piVar28 = (int *)((long)local_d8 + uVar24);
        ms = local_e0;
        local_d0 = piVar28;
        do {
          if (local_b0 < piVar28) break;
          uVar10 = ((int)piVar28 - (int)local_f0) - uVar21;
          pBVar23 = local_f0;
          if (uVar10 < (uint)local_c0) {
            pBVar23 = local_78;
          }
          if ((uVar10 - (uint)local_c0 < 0xfffffffd) && (*(int *)(pBVar23 + uVar10) == *piVar28)) {
            piVar13 = iEnd;
            if (uVar10 < (uint)local_c0) {
              piVar13 = local_a8;
            }
            sVar11 = ZSTD_count_2segments
                               ((BYTE *)(piVar28 + 1),(BYTE *)((long)(pBVar23 + uVar10) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar13,local_a0);
            if (psVar8->maxNbSeq <=
                (ulong)((long)psVar8->sequences - (long)psVar8->sequencesStart >> 3))
            goto LAB_001e5f15;
            if (0x20000 < psVar8->maxNbLit) goto LAB_001e5f53;
            pBVar23 = psVar8->lit;
            if (psVar8->litStart + psVar8->maxNbLit < pBVar23) goto LAB_001e5f91;
            if (iEnd < local_d0) goto LAB_001e5f34;
            if (local_80 < local_d0) {
              ZSTD_safecopyLiterals(pBVar23,(BYTE *)local_d0,(BYTE *)local_d0,(BYTE *)local_80);
            }
            else {
              uVar7 = *(undefined8 *)(local_d0 + 2);
              *(undefined8 *)pBVar23 = *(undefined8 *)local_d0;
              *(undefined8 *)(pBVar23 + 8) = uVar7;
            }
            psVar4 = psVar8->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (sVar11 + 4 < 3) goto LAB_001e5f72;
            if (0xffff < sVar11 + 1) {
              if (psVar8->longLengthType != ZSTD_llt_none) goto LAB_001e5fb0;
              psVar8->longLengthType = ZSTD_llt_matchLength;
              psVar8->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)psVar8->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar11 + 1);
            psVar8->sequences = psVar4 + 1;
            piVar28 = (int *)((long)piVar28 + sVar11 + 4);
            bVar5 = true;
            ms = local_e0;
            uVar10 = local_f8;
            local_f8 = uVar21;
            local_d0 = piVar28;
          }
          else {
            bVar5 = false;
            uVar10 = uVar21;
          }
          uVar21 = uVar10;
        } while (bVar5);
      }
    } while (piVar28 < local_b0);
  }
  *rep = local_f8;
  rep[1] = uVar21;
  return (long)iEnd - (long)local_d0;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_dedicatedDictSearch);
}